

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall
minja::ArrayExpr::do_evaluate(ArrayExpr *this,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  __shared_ptr *this_00;
  runtime_error *this_01;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_RSI;
  Value *in_RDI;
  shared_ptr<minja::Expression> *e;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  *__range2;
  Value *result;
  shared_ptr<minja::Context> *in_stack_00000100;
  Expression *in_stack_00000108;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  *in_stack_ffffffffffffff18;
  Value *in_stack_ffffffffffffff20;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_stack_ffffffffffffff68;
  Value *in_stack_ffffffffffffff78;
  Value *in_stack_ffffffffffffff80;
  __normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
  local_58;
  pointer *local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined1 local_19;
  
  local_19 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  std::vector<minja::Value,_std::allocator<minja::Value>_>::vector
            ((vector<minja::Value,_std::allocator<minja::Value>_> *)0x3021ba);
  Value::array(in_stack_ffffffffffffff68);
  std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(in_RSI);
  local_50 = &in_RSI[1].super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_58._M_current =
       (shared_ptr<minja::Expression> *)
       std::
       vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
       ::begin(in_stack_ffffffffffffff18);
  std::
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>::
  end(in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) {
      return in_RDI;
    }
    this_00 = (__shared_ptr *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
              ::operator*(&local_58);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (!bVar1) break;
    std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x30230a);
    Expression::evaluate(in_stack_00000108,in_stack_00000100);
    Value::push_back(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    Value::~Value(in_stack_ffffffffffffff20);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
    ::operator++(&local_58);
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Array element is null");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        auto result = Value::array();
        for (const auto& e : elements) {
            if (!e) throw std::runtime_error("Array element is null");
            result.push_back(e->evaluate(context));
        }
        return result;
    }